

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

void * apx_client_register_event_listener(apx_client_t *self,apx_clientEventListener_tag *listener)

{
  apx_clientEventListener_t *pItem;
  
  if (listener == (apx_clientEventListener_tag *)0x0 || self == (apx_client_t *)0x0) {
    pItem = (apx_clientEventListener_t *)0x0;
  }
  else {
    pItem = apx_clientEventListener_clone(listener);
    if (pItem != (apx_clientEventListener_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)&self->event_listener_lock);
      adt_list_insert(self->event_listeners,pItem);
      pthread_mutex_unlock((pthread_mutex_t *)&self->event_listener_lock);
    }
  }
  return pItem;
}

Assistant:

void* apx_client_register_event_listener(apx_client_t *self, struct apx_clientEventListener_tag *listener)
{
   if ( (self != NULL) && (listener != 0))
   {
      void *handle = (void*) apx_clientEventListener_clone(listener);
      if (handle != 0)
      {
         MUTEX_LOCK(self->event_listener_lock);
         adt_list_insert(self->event_listeners, handle);
         MUTEX_UNLOCK(self->event_listener_lock);
      }
      return handle;
   }
   return (void*) 0;
}